

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglshaderprogram.h
# Opt level: O0

void __thiscall
rengine::OpenGLShaderProgram::initialize
          (OpenGLShaderProgram *this,char *vsh,char *fsh,
          vector<const_char_*,_std::allocator<const_char_*>_> *attrs)

{
  uint uVar1;
  GLuint GVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppcVar6;
  ostream *poVar7;
  string local_68 [36];
  int local_44;
  char *pcStack_40;
  int l;
  char *str;
  int param;
  uint i;
  GLuint fid;
  GLuint vid;
  vector<const_char_*,_std::allocator<const_char_*>_> *attrs_local;
  char *fsh_local;
  char *vsh_local;
  OpenGLShaderProgram *this_local;
  
  _fid = attrs;
  attrs_local = (vector<const_char_*,_std::allocator<const_char_*>_> *)fsh;
  fsh_local = vsh;
  vsh_local = (char *)this;
  if (this->m_id != 0) {
    __assert_fail("m_id == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x3d,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  i = createShader(this,vsh,0x8b31);
  param = createShader(this,(char *)attrs_local,0x8b30);
  if (i == 0) {
    __assert_fail("vid",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x41,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  if (param == 0) {
    __assert_fail("fid",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x42,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  GVar2 = glCreateProgram();
  this->m_id = GVar2;
  glAttachShader(this->m_id,i);
  glAttachShader(this->m_id,param);
  str._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)str._4_4_;
    sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(_fid);
    uVar1 = str._4_4_;
    if (sVar5 <= uVar4) break;
    GVar2 = this->m_id;
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(_fid,(ulong)str._4_4_);
    glBindAttribLocation(GVar2,uVar1,*ppcVar6);
    str._4_4_ = str._4_4_ + 1;
  }
  glLinkProgram(this->m_id);
  str._0_4_ = 0;
  glGetProgramiv(this->m_id,0x8b82,&str);
  if ((int)str == 0) {
    glGetProgramiv(this->m_id,0x8b84,&str);
    pcStack_40 = (char *)malloc((long)((int)str + 1));
    local_44 = 0;
    glGetProgramInfoLog(this->m_id,(int)str,&local_44,pcStack_40);
    if (local_44 < (int)str) {
      pcStack_40[local_44] = '\0';
      poVar7 = std::operator<<((ostream *)&std::cerr,"E [");
      log_timestring_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,local_68);
      poVar7 = std::operator<<(poVar7,"]: ");
      poVar7 = std::operator<<(poVar7,
                               "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                              );
      poVar7 = std::operator<<(poVar7,": ");
      poVar7 = std::operator<<(poVar7,"Failed to link shader program:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"Vertex Shader:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,fsh_local);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"FragmentShader:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,(char *)attrs_local);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"error: ");
      poVar7 = std::operator<<(poVar7,pcStack_40);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_68);
      free(pcStack_40);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                    ,0x5b,
                    "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                   );
    }
    __assert_fail("l < param",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x54,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  iVar3 = glGetError();
  if (iVar3 == 0) {
    sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(_fid);
    this->m_attributeCount = (int)sVar5;
    return;
  }
  __assert_fail("glGetError() == GL_NO_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                ,0x5e,
                "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
               );
}

Assistant:

void initialize(const char *vsh, const char *fsh, const std::vector<const char *> &attrs)
    {
        assert(m_id == 0);

        GLuint vid = createShader(vsh, GL_VERTEX_SHADER);
        GLuint fid = createShader(fsh, GL_FRAGMENT_SHADER);
        assert(vid);
        assert(fid);

        m_id = glCreateProgram();
        glAttachShader(m_id, vid);
        glAttachShader(m_id, fid);

        for (unsigned i=0; i<attrs.size(); ++i)
            glBindAttribLocation(m_id, i, attrs.at(i));

        glLinkProgram(m_id);

        int param = 0;
        glGetProgramiv(m_id, GL_LINK_STATUS, &param);
        if (param == GL_FALSE) {
            glGetProgramiv(m_id, GL_INFO_LOG_LENGTH, &param);
            char *str = (char *) malloc(param + 1);
            int l = 0;
            glGetProgramInfoLog(m_id, param, &l, str);
            assert(l < param);
            str[l] = '\0';
            loge << "Failed to link shader program:" << std::endl
                 << "Vertex Shader:" << std::endl << vsh << std::endl
                 << "FragmentShader:" << std::endl << fsh << std::endl
                 << "error: " << str << std::endl;
            free(str);
            assert(false);
        }

        assert(glGetError() == GL_NO_ERROR);

        m_attributeCount = attrs.size();
    }